

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall
QSortFilterProxyModelPrivate::filter_changed
          (QSortFilterProxyModelPrivate *this,Directions directions,QModelIndex *source_parent)

{
  int iVar1;
  Span *pSVar2;
  QModelIndex *source_parent_00;
  QArrayData *data;
  QAbstractItemModel *pQVar3;
  int *piVar4;
  Node<int,_QHashDummyValue> *pNVar5;
  ulong uVar6;
  QAbstractItemModel *pQVar7;
  QModelIndex *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  const_iterator cVar10;
  QSet<int> columns_removed;
  QSet<int> rows_removed;
  int local_6c;
  undefined1 local_68 [16];
  QList<int> local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)(source_parent->m).ptr;
  local_58.d.d = *(Data **)source_parent;
  local_58.d.ptr = (int *)source_parent->i;
  cVar10 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
           constFindImpl<QtPrivate::QModelIndexWrapper>
                     (&this->source_index_mapping,(QModelIndexWrapper *)&local_58);
  if (cVar10.i.d !=
      (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
       *)0x0 || cVar10.i.bucket != 0) {
    pSVar2 = (cVar10.i.d)->spans;
    uVar6 = cVar10.i.bucket >> 7;
    source_parent_00 =
         *(QModelIndex **)
          (pSVar2[uVar6].entries[pSVar2[uVar6].offsets[(uint)cVar10.i.bucket & 0x7f]].storage.data +
          0x18);
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (((uint)directions.super_QFlagsStorageHelper<QSortFilterProxyModel::Direction,_4>.
               super_QFlagsStorage<QSortFilterProxyModel::Direction>.i & 1) == 0) {
      local_68._8_8_ = (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0;
    }
    else {
      handle_filter_changed
                ((QSortFilterProxyModelPrivate *)(local_68 + 8),(QList<int> *)this,
                 (QList<int> *)(source_parent_00 + 2),source_parent_00,(Direction)source_parent);
    }
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (((uint)directions.super_QFlagsStorageHelper<QSortFilterProxyModel::Direction,_4>.
               super_QFlagsStorage<QSortFilterProxyModel::Direction>.i & 2) == 0) {
      local_68._0_8_ = (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0;
    }
    else {
      handle_filter_changed
                ((QSortFilterProxyModelPrivate *)local_68,(QList<int> *)this,
                 (QList<int> *)(source_parent_00 + 3),source_parent_00 + 1,(Direction)source_parent)
      ;
    }
    data = *(QArrayData **)(source_parent_00 + 4);
    pQVar8 = (QModelIndex *)source_parent_00[4].i;
    pQVar3 = source_parent_00[4].m.ptr;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (int *)0x0;
    local_58.d.size = 0;
    if (pQVar3 != (QAbstractItemModel *)0x0) {
      pQVar7 = (QAbstractItemModel *)0x0;
      do {
        local_3c = pQVar8->r;
        if ((((Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)local_68._8_8_ ==
              (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0) ||
            (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode<int>
                                ((Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)local_68._8_8_,
                                 &local_3c), pNVar5 == (Node<int,_QHashDummyValue> *)0x0)) &&
           ((local_6c = pQVar8->c,
            (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)local_68._0_8_ ==
            (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0 ||
            (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode<int>
                                ((Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)local_68._0_8_,
                                 &local_6c), pNVar5 == (Node<int,_QHashDummyValue> *)0x0)))) {
          filter_changed(this,directions,pQVar8);
        }
        else {
          local_3c = (int)pQVar7;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_58,local_58.d.size,&local_3c);
          QList<int>::end(&local_58);
          remove_from_mapping(this,pQVar8);
        }
        pQVar7 = (QAbstractItemModel *)((long)&(pQVar7->super_QObject)._vptr_QObject + 1);
        pQVar8 = pQVar8 + 1;
      } while (pQVar3 != pQVar7);
    }
    piVar4 = local_58.d.ptr;
    pQVar8 = source_parent_00 + 4;
    for (lVar9 = local_58.d.size << 2; lVar9 != 0; lVar9 = lVar9 + -4) {
      iVar1 = *(int *)((long)piVar4 + lVar9 + -4);
      if ((*(int **)pQVar8 == (int *)0x0) || (1 < **(int **)pQVar8)) {
        QArrayDataPointer<QModelIndex>::reallocateAndGrow
                  ((QArrayDataPointer<QModelIndex> *)pQVar8,GrowsAtEnd,0,
                   (QArrayDataPointer<QModelIndex> *)0x0);
      }
      QtPrivate::QMovableArrayOps<QModelIndex>::erase
                ((QMovableArrayOps<QModelIndex> *)pQVar8,
                 (QModelIndex *)((long)iVar1 * 0x18 + source_parent_00[4].i),1);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
      }
    }
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,0x18,0x10);
      }
    }
    QHash<int,_QHashDummyValue>::~QHash((QHash<int,_QHashDummyValue> *)local_68);
    QHash<int,_QHashDummyValue>::~QHash((QHash<int,_QHashDummyValue> *)(local_68 + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::filter_changed(Directions directions,
                                                  const QModelIndex &source_parent)
{
    IndexMap::const_iterator it = source_index_mapping.constFind(source_parent);
    if (it == source_index_mapping.constEnd())
        return;
    Mapping *m = it.value();
    const QSet<int> rows_removed = (directions & Direction::Rows)
                                 ? handle_filter_changed(m->proxy_rows, m->source_rows, source_parent,
                                                         Direction::Rows)
                                 : QSet<int>();
    const QSet<int> columns_removed = (directions & Direction::Columns)
                                 ? handle_filter_changed(m->proxy_columns, m->source_columns, source_parent,
                                                         Direction::Columns)
                                 : QSet<int>();

    // We need to iterate over a copy of m->mapped_children because otherwise it may be changed by other code, invalidating
    // the iterator it2.
    // The m->mapped_children vector can be appended to with indexes which are no longer filtered
    // out (in create_mapping) when this function recurses for child indexes.
    const QList<QModelIndex> mappedChildren = m->mapped_children;
    QList<int> indexesToRemove;
    for (int i = 0; i < mappedChildren.size(); ++i) {
        const QModelIndex &source_child_index = mappedChildren.at(i);
        if (rows_removed.contains(source_child_index.row()) || columns_removed.contains(source_child_index.column())) {
            indexesToRemove.push_back(i);
            remove_from_mapping(source_child_index);
        } else {
            filter_changed(directions, source_child_index);
        }
    }
    QList<int>::const_iterator removeIt = indexesToRemove.constEnd();
    const QList<int>::const_iterator removeBegin = indexesToRemove.constBegin();

    // We can't just remove these items from mappedChildren while iterating above and then
    // do something like m->mapped_children = mappedChildren, because mapped_children might
    // be appended to in create_mapping, and we would lose those new items.
    // Because they are always appended in create_mapping, we can still remove them by
    // position here.
    while (removeIt != removeBegin) {
        --removeIt;
        m->mapped_children.remove(*removeIt);
    }
}